

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Action.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_ACTION::action_ID(SRUP_MSG_ACTION *this,uint8_t *action)

{
  uint8_t *puVar1;
  uint8_t *action_local;
  SRUP_MSG_ACTION *this_local;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if (this->m_action != (uint8_t *)0x0) {
    operator_delete__(this->m_action);
  }
  puVar1 = (uint8_t *)operator_new(1);
  this->m_action = puVar1;
  *this->m_action = *action;
  return true;
}

Assistant:

bool SRUP_MSG_ACTION::action_ID(const uint8_t* action)
{
    m_is_serialized = false;

    delete[] m_action;

    m_action = new uint8_t;
    std::memcpy(m_action, action, 1);

    return true;
}